

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_tools.cpp
# Opt level: O0

QString * qulltoBasicLatin(qulonglong number,int base,bool negative)

{
  undefined1 auVar1 [16];
  short sVar2;
  uint uVar3;
  byte in_CL;
  int in_EDX;
  ulong in_RSI;
  undefined1 *puVar4;
  QString *in_RDI;
  long in_FS_OFFSET;
  char16_t *end;
  uint maxlen;
  char16_t *str;
  int r_1;
  int r;
  char16_t *p;
  char16_t buff [65];
  DataPointer *in_stack_fffffffffffffec8;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffed0;
  ulong local_c0;
  undefined1 *local_b8;
  QArrayDataPointer<char16_t> local_b0 [6];
  undefined1 local_16 [14];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == 0) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_b0,(Data *)0x0,L"0",1);
    QString::QString((QString *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffed0);
  }
  else {
    local_c0 = in_RSI;
    local_b8 = local_16;
    switch((QChar *)(ulong)(in_EDX - 2)) {
    case (QChar *)0x0:
      do {
        puVar4 = local_b8 + -2;
        *(ushort *)(local_b8 + -2) = ((ushort)local_c0 & 1) + 0x30;
        local_c0 = local_c0 >> 1;
        local_b8 = puVar4;
      } while (local_c0 != 0);
      break;
    default:
      do {
        sVar2 = 0x57;
        if ((int)(local_c0 % (ulong)(long)in_EDX) < 10) {
          sVar2 = 0x30;
        }
        puVar4 = local_b8 + -2;
        *(short *)(local_b8 + -2) = sVar2 + (short)(local_c0 % (ulong)(long)in_EDX);
        local_c0 = local_c0 / (ulong)(long)in_EDX;
        local_b8 = puVar4;
      } while (local_c0 != 0);
      break;
    case (QChar *)0x6:
      do {
        puVar4 = local_b8 + -2;
        *(ushort *)(local_b8 + -2) = ((ushort)local_c0 & 7) + 0x30;
        local_c0 = local_c0 >> 3;
        local_b8 = puVar4;
      } while (local_c0 != 0);
      break;
    case (QChar *)0x8:
      do {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = local_c0;
        puVar4 = local_b8 + -2;
        *(short *)(local_b8 + -2) = SUB162(auVar1 % ZEXT816(10),0) + 0x30;
        local_c0 = local_c0 / 10;
        local_b8 = puVar4;
      } while (local_c0 != 0);
      break;
    case (QChar *)0xe:
      do {
        uVar3 = (uint)local_c0 & 0xf;
        sVar2 = 0x57;
        if (uVar3 < 10) {
          sVar2 = 0x30;
        }
        puVar4 = local_b8 + -2;
        *(short *)(local_b8 + -2) = sVar2 + (short)uVar3;
        local_c0 = local_c0 >> 4;
        local_b8 = puVar4;
      } while (local_c0 != 0);
    }
    if ((in_CL & 1) != 0) {
      *(undefined2 *)(local_b8 + -2) = 0x2d;
    }
    QString::QString(in_RDI,(QChar *)(ulong)(in_EDX - 2),(qsizetype)in_stack_fffffffffffffec8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString qulltoBasicLatin(qulonglong number, int base, bool negative)
{
    if (number == 0)
        return QStringLiteral("0");
    // Length of MIN_LLONG with the sign in front is 65; we never need surrogate pairs.
    // We do not need a terminator.
    const unsigned maxlen = 65;
    static_assert(CHAR_BIT * sizeof(number) + 1 <= maxlen);
    Q_DECL_UNINITIALIZED char16_t buff[maxlen];
    char16_t *const end = buff + maxlen, *p = end;

    qulltoString_helper<char16_t>(number, base, p);
    if (negative)
        *--p = u'-';

    return QString(reinterpret_cast<QChar *>(p), end - p);
}